

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_17d44::BuildSystemFrontendExecutionQueueDelegate::processHadError
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,Twine *message)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  Twine *message_local;
  ProcessContext *command_local;
  BuildSystemFrontendExecutionQueueDelegate *this_local;
  ProcessHandle handle_local;
  
  this_00 = getSystem(this);
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
  (*pBVar1->_vptr_BuildSystemDelegate[0x18])(pBVar1,command,handle.id,message);
  return;
}

Assistant:

virtual void processHadError(ProcessContext* command, ProcessHandle handle,
                               const Twine& message) override {
    static_cast<BuildSystemFrontendDelegate*>(&getSystem().getDelegate())->
      commandProcessHadError(
          reinterpret_cast<Command*>(command),
          BuildSystemFrontendDelegate::ProcessHandle { handle.id },
          message);
  }